

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  format_specs *spec;
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  int iVar3;
  size_t __n_00;
  ulong uVar4;
  size_t extraout_RAX;
  undefined4 extraout_var;
  void *pvVar6;
  format_error *this_00;
  char *data;
  undefined4 in_register_00000034;
  char *__s;
  str_writer<char> local_38;
  size_t sVar5;
  
  __s = (char *)CONCAT44(in_register_00000034,__fd);
  if (__s == (char *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n_00 = strlen(__s);
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    pbVar1 = (this->writer_).out_.container;
    sVar2 = pbVar1->size_;
    uVar4 = sVar2 + __n_00;
    sVar5 = __n_00;
    if (pbVar1->capacity_ < uVar4) {
      iVar3 = (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar4);
      sVar5 = CONCAT44(extraout_var,iVar3);
    }
    pbVar1->size_ = uVar4;
    if (__n_00 != 0) {
      pvVar6 = memmove(pbVar1->ptr_ + sVar2,__s,__n_00);
      return (ssize_t)pvVar6;
    }
  }
  else {
    uVar4 = (ulong)spec->precision_;
    local_38.size = __n_00;
    if (uVar4 < __n_00) {
      local_38.size = uVar4;
    }
    if ((long)uVar4 < 0) {
      local_38.size = __n_00;
    }
    local_38.s = __s;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::str_writer<char>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)
               this,local_38.size,&spec->super_align_spec,&local_38);
    sVar5 = extraout_RAX;
  }
  return sVar5;
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write_str(sv, *specs_) : writer_.write(sv);
  }